

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O0

void read_bytes<unsigned_long,unsigned_int>
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *vec,size_t n_els,istream *in,
               vector<char,_std::allocator<char>_> *buffer,bool diff_endian)

{
  size_type sVar1;
  char *pcVar2;
  ulong uVar3;
  vector<char,_std::allocator<char>_> *in_RCX;
  vector<char,_std::allocator<char>_> *in_RDX;
  vector<char,_std::allocator<char>_> *in_RSI;
  byte in_R8B;
  size_t in_stack_ffffffffffffffc8;
  vector<char,_std::allocator<char>_> *buffer_00;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_RSI,(size_type)in_RDX);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::shrink_to_fit
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x670fea);
  if (in_RSI != (vector<char,_std::allocator<char>_> *)0x0) {
    sVar1 = std::vector<char,_std::allocator<char>_>::size(in_RCX);
    if (sVar1 < (ulong)((long)in_RSI << 2)) {
      std::vector<char,_std::allocator<char>_>::resize(in_RSI,(size_type)in_RDX);
    }
    buffer_00 = in_RDX;
    pcVar2 = std::vector<char,_std::allocator<char>_>::data
                       ((vector<char,_std::allocator<char>_> *)0x671038);
    std::istream::read((char *)in_RDX,(long)pcVar2);
    uVar3 = std::ios::bad();
    if ((uVar3 & 1) != 0) {
      throw_errno();
    }
    if ((in_R8B & 1) != 0) {
      std::vector<char,_std::allocator<char>_>::data
                ((vector<char,_std::allocator<char>_> *)0x67107b);
      swap_endianness<unsigned_int>((uint *)in_RDX,in_stack_ffffffffffffffc8);
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x671092);
    convert_dtype<unsigned_long,unsigned_int>(in_RSI,buffer_00,(size_t)in_RCX);
  }
  return;
}

Assistant:

void read_bytes(std::vector<dtype> &vec, const size_t n_els, std::istream &in, std::vector<char> &buffer, const bool diff_endian)
{
    if (std::is_same<dtype, saved_type>::value)
    {
        read_bytes<dtype>(vec, n_els, in);
        if (unlikely(diff_endian)) swap_endianness(vec.data(), n_els);
        return;
    }
    vec.resize(n_els);
    vec.shrink_to_fit();

    if (n_els) {
        if (unlikely(buffer.size() < n_els * sizeof(saved_type)))
            buffer.resize((size_t)2 * n_els * sizeof(saved_type));
        in.read(buffer.data(), n_els * sizeof(saved_type));
        if (unlikely(in.bad())) throw_errno();

        if (unlikely(diff_endian)) swap_endianness((saved_type*)buffer.data(), n_els);
        convert_dtype<dtype, saved_type>(vec.data(), buffer, n_els);
    }
}